

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O2

void __thiscall ACustomBridge::BeginPlay(ACustomBridge *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((this->super_AActor).args[2] == 0) {
    uVar1 = *(undefined8 *)(this->super_AActor).args;
    iVar4 = (int)uVar1;
    iVar7 = (int)((ulong)uVar1 >> 0x20);
    auVar3._0_4_ = -(uint)(iVar4 == 0);
    auVar3._4_4_ = -(uint)(iVar4 == 0);
    auVar3._8_4_ = -(uint)(iVar7 == 0);
    auVar3._12_4_ = -(uint)(iVar7 == 0);
    auVar6._0_8_ = (double)iVar4;
    auVar6._8_8_ = (double)iVar7;
    auVar3 = auVar3 & _DAT_005e6d10 | ~auVar3 & auVar6;
    (this->super_AActor).RenderStyle = LegacyRenderStyles[1];
  }
  else {
    AActor::SetState(&this->super_AActor,(this->super_AActor).SeeState,false);
    uVar1 = *(undefined8 *)(this->super_AActor).args;
    iVar4 = (int)uVar1;
    iVar7 = (int)((ulong)uVar1 >> 0x20);
    auVar2._0_4_ = -(uint)(iVar4 == 0);
    auVar2._4_4_ = -(uint)(iVar4 == 0);
    auVar2._8_4_ = -(uint)(iVar7 == 0);
    auVar2._12_4_ = -(uint)(iVar7 == 0);
    auVar5._0_8_ = (double)iVar4;
    auVar5._8_8_ = (double)iVar7;
    auVar3 = auVar2 & _DAT_005e6d00 | ~auVar2 & auVar5;
  }
  (this->super_AActor).radius = (double)auVar3._0_8_;
  (this->super_AActor).Height = (double)auVar3._8_8_;
  return;
}

Assistant:

void ACustomBridge::BeginPlay ()
{
	if (args[2]) // Hexen bridge if there are balls
	{
		SetState(SeeState);
		radius = args[0] ? args[0] : 32;
		Height = args[1] ? args[1] : 2;
	}
	else // No balls? Then a Doom bridge.
	{
		radius = args[0] ? args[0] : 36;
		Height = args[1] ? args[1] : 4;
		RenderStyle = STYLE_Normal;
	}
}